

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void ObsGetHandCardKnowledge
               (pyhanabi_observation_t *observation,int pid,int index,
               pyhanabi_card_knowledge_t *knowledge)

{
  const_reference pvVar1;
  const_reference pvVar2;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2c2,
                  "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
                 );
  }
  if (observation->observation != (void *)0x0) {
    if (knowledge != (pyhanabi_card_knowledge_t *)0x0) {
      pvVar1 = std::
               vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
               ::at((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                     *)((long)observation->observation + 8),(long)pid);
      pvVar2 = std::
               vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
               ::at(&pvVar1->card_knowledge_,(long)index);
      knowledge->knowledge = pvVar2;
      return;
    }
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2c4,
                  "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
                 );
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x2c3,
                "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
               );
}

Assistant:

void ObsGetHandCardKnowledge(pyhanabi_observation_t* observation, int pid,
                             int index, pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(knowledge != nullptr);
  knowledge->knowledge =
      &(reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
            observation->observation)
            ->Hands()
            .at(pid)
            .Knowledge()
            .at(index));
}